

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptObject.cpp
# Opt level: O3

Var Js::JavascriptObject::EntryIsPrototypeOf(RecyclableObject *function,CallInfo callInfo,...)

{
  ScriptContext *pSVar1;
  code *pcVar2;
  bool bVar3;
  uint uVar4;
  BOOL BVar5;
  undefined4 *puVar6;
  Var pvVar7;
  RecyclableObject *instance;
  long lVar8;
  int in_stack_00000010;
  CallInfo local_40;
  CallInfo callInfo_local;
  ArgumentReader args;
  RecyclableObject *dynamicObject;
  
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  local_40 = callInfo;
  ThreadContext::ProbeStack(pSVar1->threadContext,0xc00,pSVar1,(PVOID)0x0);
  if (in_stack_00000010 != callInfo._0_4_) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x14b,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar3) goto LAB_00cdfdb8;
    *puVar6 = 0;
  }
  args.super_Arguments.Info = (Type)&stack0x00000018;
  callInfo_local = callInfo;
  ArgumentReader::AdjustArguments((ArgumentReader *)&callInfo_local,&local_40);
  pSVar1 = (((((function->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
           scriptContext.ptr;
  if (((ulong)local_40 & 0x1000000) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x14e,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar3) goto LAB_00cdfdb8;
    *puVar6 = 0;
  }
  uVar4 = (uint)((ulong)callInfo_local & 0xffffff);
  if (((ulong)callInfo_local & 0xffffff) == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptObject.cpp"
                                ,0x150,"(args.Info.Count > 0)",
                                "Should always have implicit \'this\'");
    if (!bVar3) {
LAB_00cdfdb8:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
    uVar4 = callInfo_local._0_4_ & 0xffffff;
  }
  if (uVar4 != 1) {
    pvVar7 = Arguments::operator[]((Arguments *)&callInfo_local,1);
    BVar5 = JavascriptOperators::IsObject(pvVar7);
    if (BVar5 != 0) {
      args.super_Arguments.Values = (Type)0x0;
      pvVar7 = Arguments::operator[]((Arguments *)&callInfo_local,0);
      BVar5 = JavascriptConversion::ToObject
                        (pvVar7,pSVar1,(RecyclableObject **)&args.super_Arguments.Values);
      if (BVar5 == 0) {
        JavascriptError::ThrowTypeError(pSVar1,-0x7ff5ec42,L"Object.prototype.isPrototypeOf");
      }
      pvVar7 = Arguments::operator[]((Arguments *)&callInfo_local,1);
      instance = VarTo<Js::RecyclableObject>(pvVar7);
      if (*args.super_Arguments.Values[1] == 0x50) {
        pvVar7 = GlobalObject::ToThis((GlobalObject *)args.super_Arguments.Values);
        args.super_Arguments.Values = (Type)VarTo<Js::RecyclableObject>(pvVar7);
      }
      do {
        BVar5 = JavascriptOperators::IsNull(instance);
        if (BVar5 != 0) {
          lVar8 = 0x3f0;
          goto LAB_00cdfda5;
        }
        instance = JavascriptOperators::GetPrototype(instance);
      } while ((RecyclableObject *)args.super_Arguments.Values != instance);
      lVar8 = 1000;
LAB_00cdfda5:
      return *(Var *)((long)&(((pSVar1->super_ScriptContextBase).javascriptLibrary)->
                             super_JavascriptLibraryBase).super_FinalizableObject.
                             super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject + lVar8);
    }
  }
  return (((pSVar1->super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
         booleanFalse.ptr;
}

Assistant:

Var JavascriptObject::EntryIsPrototypeOf(RecyclableObject* function, CallInfo callInfo, ...)
{
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

    ARGUMENTS(args, callInfo);
    ScriptContext* scriptContext = function->GetScriptContext();

    Assert(!(callInfo.Flags & CallFlags_New));

    AssertMsg(args.Info.Count > 0, "Should always have implicit 'this'");

    // no property specified
    if (args.Info.Count == 1 || !JavascriptOperators::IsObject(args[1]))
    {
        return scriptContext->GetLibrary()->GetFalse();
    }

    RecyclableObject* dynamicObject = nullptr;
    if (FALSE == JavascriptConversion::ToObject(args[0], scriptContext, &dynamicObject))
    {
        JavascriptError::ThrowTypeError(scriptContext, JSERR_This_NullOrUndefined, _u("Object.prototype.isPrototypeOf"));
    }
    RecyclableObject* value = VarTo<RecyclableObject>(args[1]);

    if (dynamicObject->GetTypeId() == TypeIds_GlobalObject)
    {
        dynamicObject = VarTo<RecyclableObject>(static_cast<Js::GlobalObject*>(dynamicObject)->ToThis());
    }

    while (!JavascriptOperators::IsNull(value))
    {
        value = JavascriptOperators::GetPrototype(value);
        if (dynamicObject == value)
        {
            return scriptContext->GetLibrary()->GetTrue();
        }
    }

    return scriptContext->GetLibrary()->GetFalse();
}